

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O1

void anon_unknown.dwarf_1635f0::readWholeFiles(int modification)

{
  float fVar1;
  LineOrder LVar2;
  Compression CVar3;
  size_t sVar4;
  char *fileName;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Header *this;
  Box2i *pBVar11;
  Box2i *pBVar12;
  float *pfVar13;
  V2f *pVVar14;
  V2f *pVVar15;
  LineOrder *pLVar16;
  Compression *pCVar17;
  ChannelList *this_00;
  ChannelList *other;
  string *psVar18;
  string *psVar19;
  uint *puVar20;
  ostream *poVar21;
  undefined4 uVar22;
  uint uVar23;
  undefined8 uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  undefined1 in_R10B;
  ulong uVar28;
  long lVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar34;
  int iVar35;
  DeepScanLineInputPart part_1;
  vector<int,_std::allocator<int>_> shuffledPartNumber;
  Array2D<unsigned_int> sampleCount;
  Array2D<half_*> deepHData;
  Array2D<float_*> deepFData;
  Array2D<unsigned_int_*> deepUData;
  MultiPartInputFile file;
  FrameBuffer frameBuffer;
  Array2D<half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  InputPart part;
  int local_1fc;
  DeepScanLineInputPart local_1f0;
  int *local_1e8;
  iterator iStack_1e0;
  int *local_1d8;
  Array2D<unsigned_int> local_1c8;
  uint *local_1a8;
  int local_1a0;
  int local_19c;
  Array2D<half_*> local_198;
  Array2D<float_*> local_178;
  Array2D<unsigned_int_*> local_158;
  MultiPartInputFile local_140;
  DeepFrameBuffer local_130;
  Array2D<half> local_c8;
  Array2D<float> local_a8;
  Array2D<unsigned_int> local_88;
  ulong local_70;
  Slice local_68;
  
  fileName = (anonymous_namespace)::filename_abi_cxx11_;
  local_88._sizeX = 0;
  local_88._sizeY = 0;
  local_88._data = (uint *)0x0;
  local_a8._data = (float *)0x0;
  local_a8._sizeX = 0;
  local_a8._sizeY = 0;
  local_c8._data = (half *)0x0;
  local_c8._sizeX = 0;
  local_c8._sizeY = 0;
  local_158._data = (uint **)0x0;
  local_158._sizeX = 0;
  local_158._sizeY = 0;
  local_178._data = (float **)0x0;
  local_178._sizeX = 0;
  local_178._sizeY = 0;
  local_198._data = (half **)0x0;
  local_198._sizeX = 0;
  local_198._sizeY = 0;
  local_1c8._data = (uint *)0x0;
  local_1c8._sizeX = 0;
  local_1c8._sizeY = 0;
  iVar6 = Imf_2_5::globalThreadCount();
  uVar24 = 1;
  Imf_2_5::MultiPartInputFile::MultiPartInputFile(&local_140,fileName,iVar6,true);
  lVar26 = 0;
  lVar29 = 0;
  while( true ) {
    uVar22 = (undefined4)uVar24;
    iVar6 = Imf_2_5::MultiPartInputFile::parts(&local_140);
    if (iVar6 <= lVar29) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading whole files ",0x14);
      std::ostream::flush();
      local_1e8 = (int *)0x0;
      iStack_1e0._M_current = (int *)0x0;
      local_1d8 = (int *)0x0;
      local_130._map._M_t._M_impl._0_4_ = ZEXT14(0 < modification);
      if ((int)local_130._map._M_t._M_impl._0_4_ <
          (int)((ulong)(DAT_0043e878 - (anonymous_namespace)::headers) >> 3) * -0x49249249) {
        do {
          if (iStack_1e0._M_current == local_1d8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_1e8,iStack_1e0,(int *)&local_130);
          }
          else {
            *iStack_1e0._M_current = local_130._map._M_t._M_impl._0_4_;
            iStack_1e0._M_current = iStack_1e0._M_current + 1;
          }
          local_130._map._M_t._M_impl._0_4_ = local_130._map._M_t._M_impl._0_4_ + 1;
        } while ((int)local_130._map._M_t._M_impl._0_4_ <
                 (int)((ulong)(DAT_0043e878 - (anonymous_namespace)::headers) >> 3) * -0x49249249);
      }
      if ((long)iStack_1e0._M_current - (long)local_1e8 != 0) {
        uVar27 = (long)iStack_1e0._M_current - (long)local_1e8 >> 2;
        uVar28 = 0;
        do {
          iVar34 = random_int((int)uVar27);
          iVar35 = random_int((int)((ulong)((long)iStack_1e0._M_current - (long)local_1e8) >> 2));
          iVar6 = local_1e8[iVar34];
          local_1e8[iVar34] = local_1e8[iVar35];
          local_1e8[iVar35] = iVar6;
          uVar28 = uVar28 + 1;
          uVar27 = (long)iStack_1e0._M_current - (long)local_1e8 >> 2;
        } while (uVar28 < uVar27);
      }
      if (iStack_1e0._M_current != local_1e8) {
        uVar27 = 0;
        do {
          iVar6 = local_1e8[uVar27];
          lVar26 = (long)iVar6;
          local_70 = uVar27;
          switch(*(undefined4 *)((anonymous_namespace)::partTypes + lVar26 * 4)) {
          case 0:
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            setInputFrameBuffer((FrameBuffer *)&local_130,
                                *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&local_88,
                                &local_a8,&local_c8,0x10,0x10);
            Imf_2_5::InputPart::InputPart((InputPart *)&local_68,&local_140,iVar6);
            Imf_2_5::InputPart::setFrameBuffer((InputPart *)&local_68,(FrameBuffer *)&local_130);
            Imf_2_5::InputPart::readPixels((InputPart *)&local_68,0,0xf);
            iVar34 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
            if (iVar34 == 0) {
              bVar5 = checkPixels<unsigned_int>(&local_88,0,0xf,0,0xf,0x10);
              if (!bVar5) {
                __assert_fail("checkPixels<unsigned int>(uData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                              ,0x32c,"void (anonymous namespace)::readWholeFiles(int)");
              }
            }
            else if (iVar34 == 1) {
              bVar5 = checkPixels<float>(&local_a8,0,0xf,0,0xf,0x10);
              if (!bVar5) {
                __assert_fail("checkPixels<float>(fData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                              ,0x32f,"void (anonymous namespace)::readWholeFiles(int)");
              }
            }
            else if ((iVar34 == 2) &&
                    (bVar5 = checkPixels<half>(&local_c8,0,0xf,0,0xf,0x10), !bVar5)) {
              __assert_fail("checkPixels<half>(hData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x332,"void (anonymous namespace)::readWholeFiles(int)");
            }
            std::
            _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                         *)&local_130);
            break;
          case 1:
            Imf_2_5::TiledInputPart::TiledInputPart((TiledInputPart *)&local_68,&local_140,iVar6);
            iVar34 = Imf_2_5::TiledInputPart::numXLevels((TiledInputPart *)&local_68);
            local_1a8 = (uint *)CONCAT44(local_1a8._4_4_,iVar34);
            iVar34 = Imf_2_5::TiledInputPart::numYLevels((TiledInputPart *)&local_68);
            if (0 < (int)local_1a8) {
              iVar35 = 0;
              do {
                if (0 < iVar34) {
                  iVar7 = 0;
                  do {
                    bVar5 = Imf_2_5::TiledInputPart::isValidLevel
                                      ((TiledInputPart *)&local_68,iVar35,iVar7);
                    if (bVar5) {
                      iVar9 = Imf_2_5::TiledInputPart::levelWidth
                                        ((TiledInputPart *)&local_68,iVar35);
                      iVar25 = Imf_2_5::TiledInputPart::levelHeight
                                         ((TiledInputPart *)&local_68,iVar7);
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                           (_Base_ptr)0x0;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                           &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                           local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                      setInputFrameBuffer((FrameBuffer *)&local_130,
                                          *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),
                                          &local_88,&local_a8,&local_c8,iVar9,iVar25);
                      Imf_2_5::TiledInputPart::setFrameBuffer
                                ((TiledInputPart *)&local_68,(FrameBuffer *)&local_130);
                      iVar8 = Imf_2_5::TiledInputPart::numXTiles((TiledInputPart *)&local_68,iVar35)
                      ;
                      iVar10 = Imf_2_5::TiledInputPart::numYTiles((TiledInputPart *)&local_68,iVar7)
                      ;
                      Imf_2_5::TiledInputPart::readTiles
                                ((TiledInputPart *)&local_68,0,iVar8 + -1,0,iVar10 + -1,iVar35,iVar7
                                );
                      iVar8 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
                      if (iVar8 == 0) {
                        bVar5 = checkPixels<unsigned_int>
                                          (&local_88,0,iVar9 + -1,0,iVar25 + -1,iVar9);
                        if (!bVar5) {
                          __assert_fail("checkPixels<unsigned int>(uData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                        ,0x350,"void (anonymous namespace)::readWholeFiles(int)");
                        }
                      }
                      else if (iVar8 == 1) {
                        bVar5 = checkPixels<float>(&local_a8,0,iVar9 + -1,0,iVar25 + -1,iVar9);
                        if (!bVar5) {
                          __assert_fail("checkPixels<float>(fData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                        ,0x353,"void (anonymous namespace)::readWholeFiles(int)");
                        }
                      }
                      else if ((iVar8 == 2) &&
                              (bVar5 = checkPixels<half>(&local_c8,0,iVar9 + -1,0,iVar25 + -1,iVar9)
                              , !bVar5)) {
                        __assert_fail("checkPixels<half>(hData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                      ,0x356,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                      std::
                      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                                   *)&local_130);
                    }
                    iVar7 = iVar7 + 1;
                  } while (iVar34 != iVar7);
                }
                iVar35 = iVar35 + 1;
              } while (iVar35 != (int)local_1a8);
            }
            break;
          case 2:
            Imf_2_5::DeepScanLineInputPart::DeepScanLineInputPart(&local_1f0,&local_140,iVar6);
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            Imf_2_5::Slice::Slice
                      (&local_130._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B,
                       SUB81(local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0))
            ;
            puVar20 = (uint *)operator_new__(0x400);
            if (local_1c8._data != (uint *)0x0) {
              operator_delete__(local_1c8._data);
            }
            local_1c8._sizeX = 0x10;
            local_1c8._sizeY = 0x10;
            local_1c8._data = puVar20;
            Imf_2_5::Slice::Slice(&local_68,UINT,(char *)puVar20,4,0x40,1,1,0.0,(bool)in_R10B,false)
            ;
            Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&local_130,&local_68);
            setInputDeepFrameBuffer
                      (&local_130,*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),
                       &local_158,&local_178,&local_198,0x10,0x10);
            Imf_2_5::DeepScanLineInputPart::setFrameBuffer(&local_1f0,&local_130);
            Imf_2_5::DeepScanLineInputPart::readPixelSampleCounts(&local_1f0,0,0xf);
            allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&local_1c8,
                           &local_158,&local_178,&local_198,0,0xf,0,0xf);
            Imf_2_5::DeepScanLineInputPart::readPixels(&local_1f0,0,0xf);
            iVar34 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
            if (iVar34 == 0) {
              bVar5 = checkPixels<unsigned_int>(&local_1c8,&local_158,0,0xf,0,0xf,0x10);
              if (!bVar5) {
                __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                              ,0x376,"void (anonymous namespace)::readWholeFiles(int)");
              }
            }
            else if (iVar34 == 1) {
              bVar5 = checkPixels<float>(&local_1c8,&local_178,0,0xf,0,0xf,0x10);
              if (!bVar5) {
                __assert_fail("checkPixels<float>(sampleCount, deepFData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                              ,0x379,"void (anonymous namespace)::readWholeFiles(int)");
              }
            }
            else if ((iVar34 == 2) &&
                    (bVar5 = checkPixels<half>(&local_1c8,&local_198,0,0xf,0,0xf,0x10), !bVar5)) {
              __assert_fail("checkPixels<half>(sampleCount, deepHData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                            ,0x37c,"void (anonymous namespace)::readWholeFiles(int)");
            }
            releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),&local_158,
                          &local_178,&local_198,0,0xf,0,0xf);
            std::
            _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
            ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                         *)&local_130);
            break;
          case 3:
            Imf_2_5::DeepTiledInputPart::DeepTiledInputPart
                      ((DeepTiledInputPart *)&local_1f0,&local_140,iVar6);
            local_1a0 = Imf_2_5::DeepTiledInputPart::numXLevels((DeepTiledInputPart *)&local_1f0);
            local_19c = Imf_2_5::DeepTiledInputPart::numYLevels((DeepTiledInputPart *)&local_1f0);
            if (0 < local_1a0) {
              local_1fc = 0;
              do {
                if (0 < local_19c) {
                  iVar34 = 0;
                  puVar20 = local_1c8._data;
                  do {
                    bVar5 = Imf_2_5::DeepTiledInputPart::isValidLevel
                                      ((DeepTiledInputPart *)&local_1f0,local_1fc,iVar34);
                    if (bVar5) {
                      iVar35 = Imf_2_5::DeepTiledInputPart::levelWidth
                                         ((DeepTiledInputPart *)&local_1f0,local_1fc);
                      iVar7 = Imf_2_5::DeepTiledInputPart::levelHeight
                                        ((DeepTiledInputPart *)&local_1f0,iVar34);
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                           (_Base_ptr)0x0;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                           &local_130._map._M_t._M_impl.super__Rb_tree_header._M_header;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                      local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                           local_130._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                      Imf_2_5::Slice::Slice
                                (&local_130._sampleCounts,HALF,(char *)0x0,0,0,1,1,0.0,(bool)in_R10B
                                 ,SUB81(local_130._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_left,0));
                      lVar29 = (long)iVar35;
                      uVar27 = iVar7 * lVar29;
                      local_1a8 = (uint *)operator_new__(-(ulong)(uVar27 >> 0x3e != 0) | uVar27 * 4)
                      ;
                      if (puVar20 != (uint *)0x0) {
                        operator_delete__(puVar20);
                      }
                      local_1c8._data = local_1a8;
                      local_1c8._sizeX = (long)iVar7;
                      local_1c8._sizeY = lVar29;
                      Imf_2_5::Slice::Slice
                                (&local_68,UINT,(char *)local_1a8,4,lVar29 << 2,1,1,0.0,
                                 (bool)in_R10B,false);
                      Imf_2_5::DeepFrameBuffer::insertSampleCountSlice(&local_130,&local_68);
                      setInputDeepFrameBuffer
                                (&local_130,*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4)
                                 ,&local_158,&local_178,&local_198,iVar35,iVar7);
                      Imf_2_5::DeepTiledInputPart::setFrameBuffer
                                ((DeepTiledInputPart *)&local_1f0,&local_130);
                      iVar8 = Imf_2_5::DeepTiledInputPart::numXTiles
                                        ((DeepTiledInputPart *)&local_1f0,local_1fc);
                      iVar9 = Imf_2_5::DeepTiledInputPart::numYTiles
                                        ((DeepTiledInputPart *)&local_1f0,iVar34);
                      Imf_2_5::DeepTiledInputPart::readPixelSampleCounts
                                ((DeepTiledInputPart *)&local_1f0,0,iVar8 + -1,0,iVar9 + -1,
                                 local_1fc,iVar34);
                      iVar25 = iVar35 + -1;
                      iVar7 = iVar7 + -1;
                      allocatePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),
                                     &local_1c8,&local_158,&local_178,&local_198,0,iVar25,0,iVar7);
                      Imf_2_5::DeepTiledInputPart::readTiles
                                ((DeepTiledInputPart *)&local_1f0,0,iVar8 + -1,0,iVar9 + -1,
                                 local_1fc,iVar34);
                      iVar8 = *(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4);
                      if (iVar8 == 0) {
                        bVar5 = checkPixels<unsigned_int>
                                          (&local_1c8,&local_158,0,iVar25,0,iVar7,iVar35);
                        if (!bVar5) {
                          __assert_fail("checkPixels<unsigned int>(sampleCount, deepUData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                        ,0x3ad,"void (anonymous namespace)::readWholeFiles(int)");
                        }
                      }
                      else if (iVar8 == 1) {
                        bVar5 = checkPixels<float>(&local_1c8,&local_178,0,iVar25,0,iVar7,iVar35);
                        if (!bVar5) {
                          __assert_fail("checkPixels<float>(sampleCount, deepFData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                        ,0x3b0,"void (anonymous namespace)::readWholeFiles(int)");
                        }
                      }
                      else if ((iVar8 == 2) &&
                              (bVar5 = checkPixels<half>(&local_1c8,&local_198,0,iVar25,0,iVar7,
                                                         iVar35), !bVar5)) {
                        __assert_fail("checkPixels<half>(sampleCount, deepHData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                                      ,0x3b3,"void (anonymous namespace)::readWholeFiles(int)");
                      }
                      releasePixels(*(int *)((anonymous_namespace)::pixelTypes + lVar26 * 4),
                                    &local_158,&local_178,&local_198,0,iVar25,0,iVar7);
                      std::
                      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::DeepSlice>_>_>
                                   *)&local_130);
                      puVar20 = local_1a8;
                    }
                    iVar34 = iVar34 + 1;
                  } while (local_19c != iVar34);
                }
                local_1fc = local_1fc + 1;
              } while (local_1fc != local_1a0);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"part ",5);
          poVar21 = (ostream *)std::ostream::operator<<(&std::cerr,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar21," ok ",4);
          uVar27 = local_70 + 1;
        } while (uVar27 < (ulong)((long)iStack_1e0._M_current - (long)local_1e8 >> 2));
      }
      if (local_1e8 != (int *)0x0) {
        operator_delete(local_1e8,(long)local_1d8 - (long)local_1e8);
      }
      Imf_2_5::MultiPartInputFile::~MultiPartInputFile(&local_140);
      if (local_1c8._data != (uint *)0x0) {
        operator_delete__(local_1c8._data);
      }
      if (local_198._data != (half **)0x0) {
        operator_delete__(local_198._data);
      }
      if (local_178._data != (float **)0x0) {
        operator_delete__(local_178._data);
      }
      if (local_158._data != (uint **)0x0) {
        operator_delete__(local_158._data);
      }
      if (local_c8._data != (half *)0x0) {
        operator_delete__(local_c8._data);
      }
      if (local_a8._data != (float *)0x0) {
        operator_delete__(local_a8._data);
      }
      if (local_88._data != (uint *)0x0) {
        operator_delete__(local_88._data);
      }
      return;
    }
    this = Imf_2_5::MultiPartInputFile::header(&local_140,(int)lVar29);
    pBVar11 = Imf_2_5::Header::displayWindow(this);
    pBVar12 = Imf_2_5::Header::displayWindow((Header *)((anonymous_namespace)::headers + lVar26));
    iVar6 = -(uint)((pBVar12->min).x == (pBVar11->min).x);
    iVar34 = -(uint)((pBVar12->min).y == (pBVar11->min).y);
    auVar30._4_4_ = iVar6;
    auVar30._0_4_ = iVar6;
    auVar30._8_4_ = iVar34;
    auVar30._12_4_ = iVar34;
    iVar6 = movmskpd(uVar22,auVar30);
    if ((iVar6 != 3) ||
       (iVar34 = -(uint)((pBVar12->max).x == (pBVar11->max).x),
       iVar35 = -(uint)((pBVar12->max).y == (pBVar11->max).y), auVar31._4_4_ = iVar34,
       auVar31._0_4_ = iVar34, auVar31._8_4_ = iVar35, auVar31._12_4_ = iVar35,
       iVar34 = movmskpd((int)pBVar12,auVar31), iVar34 != 3)) {
      __assert_fail("header.displayWindow() == headers[i].displayWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f0,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pBVar11 = Imf_2_5::Header::dataWindow(this);
    pBVar12 = Imf_2_5::Header::dataWindow((Header *)((anonymous_namespace)::headers + lVar26));
    iVar34 = -(uint)((pBVar12->min).x == (pBVar11->min).x);
    iVar35 = -(uint)((pBVar12->min).y == (pBVar11->min).y);
    auVar32._4_4_ = iVar34;
    auVar32._0_4_ = iVar34;
    auVar32._8_4_ = iVar35;
    auVar32._12_4_ = iVar35;
    uVar23 = movmskpd(iVar6,auVar32);
    uVar27 = (ulong)uVar23;
    if ((uVar23 != 3) ||
       (iVar6 = -(uint)((pBVar12->max).x == (pBVar11->max).x),
       iVar34 = -(uint)((pBVar12->max).y == (pBVar11->max).y), auVar33._4_4_ = iVar6,
       auVar33._0_4_ = iVar6, auVar33._8_4_ = iVar34, auVar33._12_4_ = iVar34,
       iVar6 = movmskpd((int)pBVar12,auVar33), iVar6 != 3)) {
      __assert_fail("header.dataWindow() == headers[i].dataWindow()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f1,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar13 = Imf_2_5::Header::pixelAspectRatio(this);
    fVar1 = *pfVar13;
    pfVar13 = Imf_2_5::Header::pixelAspectRatio((Header *)((anonymous_namespace)::headers + lVar26))
    ;
    if ((fVar1 != *pfVar13) || (NAN(fVar1) || NAN(*pfVar13))) break;
    pVVar14 = Imf_2_5::Header::screenWindowCenter(this);
    pVVar15 = Imf_2_5::Header::screenWindowCenter
                        ((Header *)((anonymous_namespace)::headers + lVar26));
    if ((((pVVar14->x != pVVar15->x) || (NAN(pVVar14->x) || NAN(pVVar15->x))) ||
        (pVVar14->y != pVVar15->y)) || (NAN(pVVar14->y) || NAN(pVVar15->y))) {
      __assert_fail("header.screenWindowCenter() == headers[i].screenWindowCenter()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f3,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pfVar13 = Imf_2_5::Header::screenWindowWidth(this);
    fVar1 = *pfVar13;
    pfVar13 = Imf_2_5::Header::screenWindowWidth
                        ((Header *)((anonymous_namespace)::headers + lVar26));
    if ((fVar1 != *pfVar13) || (NAN(fVar1) || NAN(*pfVar13))) {
      __assert_fail("header.screenWindowWidth() == headers[i].screenWindowWidth()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f4,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pLVar16 = Imf_2_5::Header::lineOrder(this);
    LVar2 = *pLVar16;
    pLVar16 = Imf_2_5::Header::lineOrder((Header *)((anonymous_namespace)::headers + lVar26));
    if (LVar2 != *pLVar16) {
      __assert_fail("header.lineOrder() == headers[i].lineOrder()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f5,"void (anonymous namespace)::readWholeFiles(int)");
    }
    pCVar17 = Imf_2_5::Header::compression(this);
    CVar3 = *pCVar17;
    pCVar17 = Imf_2_5::Header::compression((Header *)((anonymous_namespace)::headers + lVar26));
    if (CVar3 != *pCVar17) {
      __assert_fail("header.compression() == headers[i].compression()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f6,"void (anonymous namespace)::readWholeFiles(int)");
    }
    this_00 = Imf_2_5::Header::channels(this);
    other = Imf_2_5::Header::channels((Header *)((anonymous_namespace)::headers + lVar26));
    bVar5 = Imf_2_5::ChannelList::operator==(this_00,other);
    if (!bVar5) {
      __assert_fail("header.channels() == headers[i].channels()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f7,"void (anonymous namespace)::readWholeFiles(int)");
    }
    psVar18 = Imf_2_5::Header::name_abi_cxx11_(this);
    psVar19 = Imf_2_5::Header::name_abi_cxx11_((Header *)((anonymous_namespace)::headers + lVar26));
    sVar4 = psVar18->_M_string_length;
    if ((sVar4 != psVar19->_M_string_length) ||
       ((sVar4 != 0 &&
        (iVar6 = bcmp((psVar18->_M_dataplus)._M_p,(psVar19->_M_dataplus)._M_p,sVar4), iVar6 != 0))))
    {
      __assert_fail("header.name() == headers[i].name()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                    ,0x2f8,"void (anonymous namespace)::readWholeFiles(int)");
    }
    uVar24 = CONCAT71((int7)(uVar27 >> 8),lVar29 == 0 && modification == 1);
    if (lVar29 == 0 && modification == 1) {
      psVar18 = Imf_2_5::Header::type_abi_cxx11_(this);
      psVar19 = Imf_2_5::Header::type_abi_cxx11_
                          ((Header *)((anonymous_namespace)::headers + lVar26));
      sVar4 = psVar18->_M_string_length;
      if ((sVar4 == psVar19->_M_string_length) &&
         ((sVar4 == 0 ||
          (iVar6 = bcmp((psVar18->_M_dataplus)._M_p,(psVar19->_M_dataplus)._M_p,sVar4), iVar6 == 0))
         )) {
        __assert_fail("header.type() != headers[i].type()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                      ,0x2fb,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    else {
      psVar18 = Imf_2_5::Header::type_abi_cxx11_(this);
      psVar19 = Imf_2_5::Header::type_abi_cxx11_
                          ((Header *)((anonymous_namespace)::headers + lVar26));
      sVar4 = psVar18->_M_string_length;
      if ((sVar4 != psVar19->_M_string_length) ||
         ((sVar4 != 0 &&
          (iVar6 = bcmp((psVar18->_M_dataplus)._M_p,(psVar19->_M_dataplus)._M_p,sVar4), iVar6 != 0))
         )) {
        __assert_fail("header.type() == headers[i].type()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                      ,0x2fd,"void (anonymous namespace)::readWholeFiles(int)");
      }
    }
    lVar29 = lVar29 + 1;
    lVar26 = lVar26 + 0x38;
  }
  __assert_fail("header.pixelAspectRatio() == headers[i].pixelAspectRatio()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testFutureProofing.cpp"
                ,0x2f2,"void (anonymous namespace)::readWholeFiles(int)");
}

Assistant:

void
readWholeFiles (int modification)
{
    Array2D<unsigned int> uData;
    Array2D<float> fData;
    Array2D<half> hData;

    Array2D<unsigned int*> deepUData;
    Array2D<float*> deepFData;
    Array2D<half*> deepHData;

    Array2D<unsigned int> sampleCount;

    MultiPartInputFile file(filename.c_str());
    for (int i = 0; i < file.parts(); i++)
    {
        const Header& header = file.header(i);
        assert (header.displayWindow() == headers[i].displayWindow());
        assert (header.dataWindow() == headers[i].dataWindow());
        assert (header.pixelAspectRatio() == headers[i].pixelAspectRatio());
        assert (header.screenWindowCenter() == headers[i].screenWindowCenter());
        assert (header.screenWindowWidth() == headers[i].screenWindowWidth());
        assert (header.lineOrder() == headers[i].lineOrder());
        assert (header.compression() == headers[i].compression());
        assert (header.channels() == headers[i].channels());
        assert (header.name() == headers[i].name());
        if(modification==1 && i==0)
        {
            assert (header.type() != headers[i].type());
        }else{
            assert (header.type() == headers[i].type());
        }
    }

    cout << "Reading whole files " << flush;

    
    
    //
    // Shuffle part numbers.
    //
    vector<int> shuffledPartNumber;
    for (int i = modification>0 ? 1 : 0; i < static_cast<int>(headers.size()); i++)
        shuffledPartNumber.push_back(i);
    for (size_t i = 0; i < shuffledPartNumber.size(); i++)
    {
        size_t a = random_int(shuffledPartNumber.size());
        size_t b = random_int(shuffledPartNumber.size());
        swap (shuffledPartNumber[a], shuffledPartNumber[b]);
    }


   

    //
    // Start reading whole files.
    //
    int partNumber;
    try
    {
        for (size_t i = 0; i < shuffledPartNumber.size(); i++)
        {
            partNumber = shuffledPartNumber[i];
            switch (partTypes[partNumber])
            {
                case 0:
                {
                    FrameBuffer frameBuffer;
                    setInputFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                        uData, fData, hData, width, height);

                    InputPart part(file, partNumber);
                    part.setFrameBuffer(frameBuffer);
                    part.readPixels(0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert(checkPixels<unsigned int>(uData, width, height));
                            break;
                        case 1:
                            assert(checkPixels<float>(fData, width, height));
                            break;
                        case 2:
                            assert(checkPixels<half>(hData, width, height));
                            break;
                    }
                    break;
                }
                case 1:
                {
                    TiledInputPart part(file, partNumber);
                    int numXLevels = part.numXLevels();
                    int numYLevels = part.numYLevels();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel(xLevel, yLevel))
                                continue;

                            int w = part.levelWidth(xLevel);
                            int h = part.levelHeight(yLevel);

                            FrameBuffer frameBuffer;
                            setInputFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                                uData, fData, hData, w, h);

                            part.setFrameBuffer(frameBuffer);
                            int numXTiles = part.numXTiles(xLevel);
                            int numYTiles = part.numYTiles(yLevel);
                            part.readTiles(0, numXTiles - 1, 0, numYTiles - 1, xLevel, yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert(checkPixels<unsigned int>(uData, w, h));
                                    break;
                                case 1:
                                    assert(checkPixels<float>(fData, w, h));
                                    break;
                                case 2:
                                    assert(checkPixels<half>(hData, w, h));
                                    break;
                            }
                        }
                    break;
                }
                case 2:
                {
                    DeepScanLineInputPart part(file, partNumber);

                    DeepFrameBuffer frameBuffer;

                    sampleCount.resizeErase(height, width);
                    frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                                                        (char *) (&sampleCount[0][0]),
                                                        sizeof (unsigned int) * 1,
                                                        sizeof (unsigned int) * width));

                    setInputDeepFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                            deepUData, deepFData, deepHData, width, height);

                    part.setFrameBuffer(frameBuffer);

                    part.readPixelSampleCounts(0, height - 1);

                    allocatePixels(pixelTypes[partNumber], sampleCount,
                                   deepUData, deepFData, deepHData, width, height);

                    part.readPixels(0, height - 1);
                    switch (pixelTypes[partNumber])
                    {
                        case 0:
                            assert(checkPixels<unsigned int>(sampleCount, deepUData, width, height));
                            break;
                        case 1:
                            assert(checkPixels<float>(sampleCount, deepFData, width, height));
                            break;
                        case 2:
                            assert(checkPixels<half>(sampleCount, deepHData, width, height));
                            break;
                    }

                    releasePixels(pixelTypes[partNumber],
                                  deepUData, deepFData, deepHData, width, height);

                    break;
                }
                case 3:
                {
                    DeepTiledInputPart part(file, partNumber);
                    int numXLevels = part.numXLevels();
                    int numYLevels = part.numYLevels();
                    for (int xLevel = 0; xLevel < numXLevels; xLevel++)
                        for (int yLevel = 0; yLevel < numYLevels; yLevel++)
                        {
                            if (!part.isValidLevel(xLevel, yLevel))
                                continue;

                            int w = part.levelWidth(xLevel);
                            int h = part.levelHeight(yLevel);

                            DeepFrameBuffer frameBuffer;

                            sampleCount.resizeErase(h, w);
                            frameBuffer.insertSampleCountSlice (Slice (IMF::UINT,
                                                                (char *) (&sampleCount[0][0]),
                                                                sizeof (unsigned int) * 1,
                                                                sizeof (unsigned int) * w));

                            setInputDeepFrameBuffer(frameBuffer, pixelTypes[partNumber],
                                                    deepUData, deepFData, deepHData, w, h);

                            part.setFrameBuffer(frameBuffer);

                            int numXTiles = part.numXTiles(xLevel);
                            int numYTiles = part.numYTiles(yLevel);

                            part.readPixelSampleCounts(0, numXTiles - 1, 0, numYTiles - 1,
                                                       xLevel, yLevel);

                            allocatePixels(pixelTypes[partNumber], sampleCount,
                                           deepUData, deepFData, deepHData, w, h);

                            part.readTiles(0, numXTiles - 1, 0, numYTiles - 1, xLevel, yLevel);
                            switch (pixelTypes[partNumber])
                            {
                                case 0:
                                    assert(checkPixels<unsigned int>(sampleCount, deepUData, w, h));
                                    break;
                                case 1:
                                    assert(checkPixels<float>(sampleCount, deepFData, w, h));
                                    break;
                                case 2:
                                    assert(checkPixels<half>(sampleCount, deepHData, w, h));
                                    break;
                            }

                            releasePixels(pixelTypes[partNumber],
                                          deepUData, deepFData, deepHData, w, h);
                        }

                    break;
                }
            }
            cerr << "part " << partNumber << " ok ";
            
        }
    }
    catch (...)
    {
        cout << "Error while reading part " << partNumber << endl << flush;
        throw;
    }
}